

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt5_endpoint_optimizer::compute(dxt5_endpoint_optimizer *this,params *p,results *r)

{
  uint uVar1;
  uchar uVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint high_endpoint_00;
  uint *puVar8;
  uchar *puVar9;
  byte *pbVar10;
  int index_1;
  uint alpha_1;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  int h;
  int h_delta;
  uint bit_index;
  int l;
  int l_delta;
  int cProbeAmount;
  uint high_endpoint;
  uint j;
  uint low_endpoint;
  uint i_2;
  uint local_38;
  uint local_34;
  int index;
  uint alpha;
  uint i_1;
  uint i;
  results *r_local;
  params *p_local;
  dxt5_endpoint_optimizer *this_local;
  
  this->m_pParams = p;
  this->m_pResults = r;
  if ((p->m_num_pixels == 0) || (p->m_pPixels == (color_quad_u8 *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    _i_1 = r;
    r_local = (results *)p;
    p_local = (params *)this;
    vector<unsigned_char>::resize(&this->m_unique_values,0,false);
    vector<unsigned_int>::resize(&this->m_unique_value_weights,0,false);
    for (alpha = 0; alpha < 0x100; alpha = alpha + 1) {
      this->m_unique_value_map[alpha] = -1;
    }
    for (index = 0; uVar1._0_1_ = r_local->m_first_endpoint,
        uVar1._1_1_ = r_local->m_second_endpoint, uVar1._2_1_ = r_local->m_block_type,
        uVar1._3_1_ = r_local->m_reordered, (uint)index < uVar1; index = index + 1) {
      bVar4 = color_quad<unsigned_char,_int>::operator[]
                        ((color_quad<unsigned_char,_int> *)
                         (r_local->m_error + (ulong)(uint)index * 4),*(uint *)&r_local->field_0x14);
      local_34 = (uint)bVar4;
      local_38 = this->m_unique_value_map[local_34];
      if (local_38 == 0xffffffff) {
        local_38 = vector<unsigned_char>::size(&this->m_unique_values);
        this->m_unique_value_map[local_34] = local_38;
        i_2._3_1_ = (undefined1)local_34;
        vector<unsigned_char>::push_back(&this->m_unique_values,(uchar *)((long)&i_2 + 3));
        low_endpoint = 0;
        vector<unsigned_int>::push_back(&this->m_unique_value_weights,&low_endpoint);
      }
      puVar8 = vector<unsigned_int>::operator[](&this->m_unique_value_weights,local_38);
      *puVar8 = *puVar8 + 1;
    }
    uVar6 = vector<unsigned_char>::size(&this->m_unique_values);
    if (uVar6 == 1) {
      _i_1->m_block_type = '\0';
      _i_1->m_reordered = false;
      _i_1->m_error = 0;
      puVar9 = vector<unsigned_char>::operator[](&this->m_unique_values,0);
      _i_1->m_first_endpoint = *puVar9;
      puVar9 = vector<unsigned_char>::operator[](&this->m_unique_values,0);
      _i_1->m_second_endpoint = *puVar9;
      uVar3._0_1_ = r_local->m_first_endpoint;
      uVar3._1_1_ = r_local->m_second_endpoint;
      uVar3._2_1_ = r_local->m_block_type;
      uVar3._3_1_ = r_local->m_reordered;
      memset(_i_1->m_pSelectors,0,(ulong)uVar3);
      this_local._7_1_ = true;
    }
    else {
      uVar6 = vector<unsigned_char>::size(&this->m_unique_values);
      vector<unsigned_char>::resize(&this->m_trial_selectors,uVar6,false);
      uVar6 = vector<unsigned_char>::size(&this->m_unique_values);
      vector<unsigned_char>::resize(&this->m_best_selectors,uVar6,false);
      _i_1->m_error = 0xffffffffffffffff;
      for (j = 0; uVar6 = vector<unsigned_char>::size(&this->m_unique_values), j < uVar6 - 1;
          j = j + 1) {
        pbVar10 = vector<unsigned_char>::operator[](&this->m_unique_values,j);
        bVar4 = *pbVar10;
        cProbeAmount = j;
        while( true ) {
          cProbeAmount = cProbeAmount + 1;
          uVar6 = vector<unsigned_char>::size(&this->m_unique_values);
          if (uVar6 <= (uint)cProbeAmount) break;
          pbVar10 = vector<unsigned_char>::operator[](&this->m_unique_values,cProbeAmount);
          evaluate_solution(this,(uint)bVar4,(uint)*pbVar10);
        }
      }
      if ((cCRNDXTQualityNormal < this->m_pParams->m_quality) && (this->m_pResults->m_error != 0)) {
        sparse_bit_array::resize(&this->m_flags,0x10000);
        sparse_bit_array::clear_all_bits(&this->m_flags);
        iVar7 = 8;
        if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
          iVar7 = 0x10;
        }
        for (bit_index = -iVar7; (int)bit_index <= iVar7; bit_index = bit_index + 1) {
          uVar6 = this->m_pResults->m_first_endpoint + bit_index;
          if (-1 < (int)uVar6) {
            if (0xff < (int)uVar6) break;
            for (i_3 = -iVar7; (int)i_3 <= iVar7; i_3 = i_3 + 1) {
              high_endpoint_00 = this->m_pResults->m_second_endpoint + i_3;
              if (-1 < (int)high_endpoint_00) {
                if (0xff < (int)high_endpoint_00) break;
                bVar5 = sparse_bit_array::get_bit(&this->m_flags,uVar6 * 0x100 + high_endpoint_00);
                if ((!bVar5) &&
                   (bVar5 = sparse_bit_array::get_bit
                                      (&this->m_flags,high_endpoint_00 * 0x100 + uVar6), !bVar5)) {
                  sparse_bit_array::set_bit(&this->m_flags,uVar6 * 0x100 + high_endpoint_00);
                  evaluate_solution(this,uVar6,high_endpoint_00);
                }
              }
            }
          }
        }
      }
      this->m_pResults->m_reordered = false;
      if (this->m_pResults->m_first_endpoint == this->m_pResults->m_second_endpoint) {
        for (i_5 = 0; uVar6 = vector<unsigned_char>::size(&this->m_best_selectors), i_5 < uVar6;
            i_5 = i_5 + 1) {
          puVar9 = vector<unsigned_char>::operator[](&this->m_best_selectors,i_5);
          *puVar9 = '\0';
        }
      }
      else if (this->m_pResults->m_block_type == '\0') {
        if (this->m_pResults->m_first_endpoint <= this->m_pResults->m_second_endpoint) {
          std::swap<unsigned_char>
                    (&this->m_pResults->m_first_endpoint,&this->m_pResults->m_second_endpoint);
          this->m_pResults->m_reordered = true;
          for (alpha_1 = 0; uVar6 = vector<unsigned_char>::size(&this->m_best_selectors),
              alpha_1 < uVar6; alpha_1 = alpha_1 + 1) {
            pbVar10 = vector<unsigned_char>::operator[](&this->m_best_selectors,alpha_1);
            uVar2 = *(uchar *)((long)&g_eight_alpha_invert_table + (ulong)*pbVar10);
            puVar9 = vector<unsigned_char>::operator[](&this->m_best_selectors,alpha_1);
            *puVar9 = uVar2;
          }
        }
      }
      else if (this->m_pResults->m_second_endpoint < this->m_pResults->m_first_endpoint) {
        std::swap<unsigned_char>
                  (&this->m_pResults->m_first_endpoint,&this->m_pResults->m_second_endpoint);
        this->m_pResults->m_reordered = true;
        for (i_6 = 0; uVar6 = vector<unsigned_char>::size(&this->m_best_selectors), i_6 < uVar6;
            i_6 = i_6 + 1) {
          pbVar10 = vector<unsigned_char>::operator[](&this->m_best_selectors,i_6);
          uVar2 = *(uchar *)((long)&g_six_alpha_invert_table + (ulong)*pbVar10);
          puVar9 = vector<unsigned_char>::operator[](&this->m_best_selectors,i_6);
          *puVar9 = uVar2;
        }
      }
      for (index_1 = 0; (uint)index_1 < this->m_pParams->m_num_pixels; index_1 = index_1 + 1) {
        bVar4 = color_quad<unsigned_char,_int>::operator[]
                          (this->m_pParams->m_pPixels + (uint)index_1,this->m_pParams->m_comp_index)
        ;
        puVar9 = vector<unsigned_char>::operator[]
                           (&this->m_best_selectors,this->m_unique_value_map[bVar4]);
        this->m_pResults->m_pSelectors[(uint)index_1] = *puVar9;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool dxt5_endpoint_optimizer::compute(const params& p, results& r)
    {
        m_pParams = &p;
        m_pResults = &r;

        if ((!p.m_num_pixels) || (!p.m_pPixels))
        {
            return false;
        }

        m_unique_values.resize(0);
        m_unique_value_weights.resize(0);

        for (uint i = 0; i < 256; i++)
        {
            m_unique_value_map[i] = -1;
        }

        for (uint i = 0; i < p.m_num_pixels; i++)
        {
            uint alpha = p.m_pPixels[i][p.m_comp_index];

            int index = m_unique_value_map[alpha];

            if (index == -1)
            {
                index = m_unique_values.size();

                m_unique_value_map[alpha] = index;

                m_unique_values.push_back(static_cast<uint8>(alpha));
                m_unique_value_weights.push_back(0);
            }

            m_unique_value_weights[index]++;
        }

        if (m_unique_values.size() == 1)
        {
            r.m_block_type = 0;
            r.m_reordered = false;
            r.m_error = 0;
            r.m_first_endpoint = m_unique_values[0];
            r.m_second_endpoint = m_unique_values[0];
            memset(r.m_pSelectors, 0, p.m_num_pixels);
            return true;
        }

        m_trial_selectors.resize(m_unique_values.size());
        m_best_selectors.resize(m_unique_values.size());

        r.m_error = cUINT64_MAX;

        for (uint i = 0; i < m_unique_values.size() - 1; i++)
        {
            const uint low_endpoint = m_unique_values[i];

            for (uint j = i + 1; j < m_unique_values.size(); j++)
            {
                const uint high_endpoint = m_unique_values[j];

                evaluate_solution(low_endpoint, high_endpoint);
            }
        }

        if ((m_pParams->m_quality >= cCRNDXTQualityBetter) && (m_pResults->m_error))
        {
            m_flags.resize(256 * 256);
            m_flags.clear_all_bits();

            const int cProbeAmount = (m_pParams->m_quality == cCRNDXTQualityUber) ? 16 : 8;

            for (int l_delta = -cProbeAmount; l_delta <= cProbeAmount; l_delta++)
            {
                const int l = m_pResults->m_first_endpoint + l_delta;
                if (l < 0)
                {
                    continue;
                }
                else if (l > 255)
                {
                    break;
                }
                const uint bit_index = l * 256;

                for (int h_delta = -cProbeAmount; h_delta <= cProbeAmount; h_delta++)
                {
                    const int h = m_pResults->m_second_endpoint + h_delta;
                    if (h < 0)
                    {
                        continue;
                    }
                    else if (h > 255)
                    {
                        break;
                    }

                    //if (m_flags.get_bit(bit_index + h))
                    //   continue;
                    if ((m_flags.get_bit(bit_index + h)) || (m_flags.get_bit(h * 256 + l)))
                    {
                        continue;
                    }

                    m_flags.set_bit(bit_index + h);

                    evaluate_solution(static_cast<uint>(l), static_cast<uint>(h));
                }
            }
        }

        m_pResults->m_reordered = false;
        if (m_pResults->m_first_endpoint == m_pResults->m_second_endpoint)
        {
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = 0;
            }
        }
        else if (m_pResults->m_block_type)
        {
            //if (l > h)
            //   eight alpha
            // else
            //   six alpha

            if (m_pResults->m_first_endpoint > m_pResults->m_second_endpoint)
            {
                std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
                m_pResults->m_reordered = true;
                for (uint i = 0; i < m_best_selectors.size(); i++)
                {
                    m_best_selectors[i] = g_six_alpha_invert_table[m_best_selectors[i]];
                }
            }
        }
        else if (m_pResults->m_first_endpoint <= m_pResults->m_second_endpoint)
        {
            std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
            m_pResults->m_reordered = true;
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = g_eight_alpha_invert_table[m_best_selectors[i]];
            }
        }

        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            uint alpha = m_pParams->m_pPixels[i][m_pParams->m_comp_index];

            int index = m_unique_value_map[alpha];

            m_pResults->m_pSelectors[i] = m_best_selectors[index];
        }

        return true;
    }